

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator_wrapper.cc
# Opt level: O1

int WebRtc_set_lookahead(void *handle,int lookahead)

{
  long lVar1;
  int iVar2;
  
  if (handle == (void *)0x0) {
    __assert_fail("self != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/utility/delay_estimator_wrapper.cc"
                  ,0x164,"int WebRtc_set_lookahead(void *, int)");
  }
  lVar1 = *(long *)((long)handle + 0x10);
  if (lVar1 != 0) {
    iVar2 = -1;
    if ((-1 < lookahead) && (lookahead < *(int *)(lVar1 + 0x18))) {
      *(int *)(lVar1 + 0x4c) = lookahead;
      iVar2 = lookahead;
    }
    return iVar2;
  }
  __assert_fail("self->binary_handle != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/utility/delay_estimator_wrapper.cc"
                ,0x165,"int WebRtc_set_lookahead(void *, int)");
}

Assistant:

int WebRtc_set_lookahead(void* handle, int lookahead) {
  DelayEstimator* self = (DelayEstimator*) handle;
  assert(self != NULL);
  assert(self->binary_handle != NULL);
  if ((lookahead > self->binary_handle->near_history_size - 1) ||
      (lookahead < 0)) {
    return -1;
  }
  self->binary_handle->lookahead = lookahead;
  return self->binary_handle->lookahead;
}